

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_51(QPDF *pdf,char *arg2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle QVar12;
  QPDFObjectHandle QVar13;
  QPDFObjectHandle QVar14;
  QPDFObjectHandle field;
  QPDFWriter w;
  string Tval;
  QPDFObjectHandle fields;
  QPDFObjectHandle acroform;
  QPDFObjectHandle T;
  long *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  long local_178 [3];
  long *local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_158;
  undefined1 local_150 [16];
  long local_140 [5];
  long *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long local_108 [2];
  long *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  long *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  long *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  long *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  string local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  QPDF *local_a8;
  string local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_a8 = pdf;
  QPDF::getRoot();
  local_150._0_8_ = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/AcroForm","");
  QPDFObjectHandle::getKey(local_a0);
  if ((long *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_,local_140[0] + 1);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  local_150._0_8_ = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/Fields","");
  QPDFObjectHandle::getKey(local_b8);
  if ((long *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_,local_140[0] + 1);
  }
  iVar2 = QPDFObjectHandle::getArrayNItems();
  if (0 < iVar2) {
    iVar6 = 0;
    do {
      QPDFObjectHandle::getArrayItem((int)&local_160);
      local_150._0_8_ = local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/T","");
      QPDFObjectHandle::getKey(local_40);
      if ((long *)local_150._0_8_ != local_140) {
        operator_delete((void *)local_150._0_8_,local_140[0] + 1);
      }
      cVar1 = QPDFObjectHandle::isString();
      if (cVar1 != '\0') {
        QPDFObjectHandle::getUTF8Value_abi_cxx11_();
        iVar3 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar3 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"setting r1 via parent\n",0x16);
          local_c8 = local_160;
          local_c0 = p_Stack_158;
          if (p_Stack_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Stack_158->_M_use_count = p_Stack_158->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Stack_158->_M_use_count = p_Stack_158->_M_use_count + 1;
            }
          }
          QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = extraout_RDX_00._M_pi;
          QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&local_c8;
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)local_150,QVar11);
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          local_188 = local_178;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"/2","");
          QPDFObjectHandle::newName((string *)local_50);
          QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
          QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_150;
          QPDFFormFieldObjectHelper::setV(QVar7,true);
          p_Var5 = local_48;
LAB_0012e795:
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          if (local_188 != local_178) {
            operator_delete(local_188,local_178[0] + 1);
          }
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)local_150);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_118);
          if (iVar3 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"setting r2 via child\n",0x15);
            local_150._0_8_ = local_140;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/Kids","");
            QPDFObjectHandle::getKey(local_60);
            QPDFObjectHandle::getArrayItem((int)&local_188);
            p_Var5 = p_Stack_158;
            p_Stack_158 = p_Stack_180;
            local_160 = local_188;
            local_188 = (long *)0x0;
            p_Stack_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            _Var4._M_pi = extraout_RDX_01;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              _Var4._M_pi = extraout_RDX_02;
            }
            if (p_Stack_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_180);
              _Var4._M_pi = extraout_RDX_03;
            }
            if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
              _Var4._M_pi = extraout_RDX_04;
            }
            if ((long *)local_150._0_8_ != local_140) {
              operator_delete((void *)local_150._0_8_,local_140[0] + 1);
              _Var4._M_pi = extraout_RDX_05;
            }
            local_d8 = local_160;
            local_d0 = p_Stack_158;
            if (p_Stack_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_158->_M_use_count = p_Stack_158->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_158->_M_use_count = p_Stack_158->_M_use_count + 1;
              }
            }
            QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = _Var4._M_pi;
            QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)&local_d8;
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)local_150,QVar12);
            if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
            }
            local_188 = local_178;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"/3","");
            QPDFObjectHandle::newName((string *)local_70);
            QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
            QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_150;
            QPDFFormFieldObjectHelper::setV(QVar8,true);
            p_Var5 = local_68;
            goto LAB_0012e795;
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_118);
          if (iVar3 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"turning checkbox1 on\n",0x15);
            local_e8 = local_160;
            local_e0 = p_Stack_158;
            if (p_Stack_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_158->_M_use_count = p_Stack_158->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_158->_M_use_count = p_Stack_158->_M_use_count + 1;
              }
            }
            QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = extraout_RDX_06._M_pi;
            QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)&local_e8;
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)local_150,QVar13);
            if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
            }
            local_188 = local_178;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"/Sure","");
            QPDFObjectHandle::newName((string *)local_80);
            QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80;
            QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_150;
            QPDFFormFieldObjectHelper::setV(QVar9,true);
            p_Var5 = local_78;
            goto LAB_0012e795;
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_118);
          if (iVar3 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"turning checkbox2 off\n",0x16);
            local_f8 = local_160;
            local_f0 = p_Stack_158;
            if (p_Stack_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_158->_M_use_count = p_Stack_158->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_158->_M_use_count = p_Stack_158->_M_use_count + 1;
              }
            }
            QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = extraout_RDX._M_pi;
            QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)&local_f8;
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)local_150,QVar14);
            if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
            }
            local_188 = local_178;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"/Off","");
            QPDFObjectHandle::newName((string *)local_90);
            QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90;
            QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_150;
            QPDFFormFieldObjectHelper::setV(QVar10,true);
            p_Var5 = local_88;
            goto LAB_0012e795;
          }
        }
        if (local_118 != local_108) {
          operator_delete(local_118,local_108[0] + 1);
        }
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if (p_Stack_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_158);
      }
      iVar6 = iVar6 + 1;
    } while (iVar2 != iVar6);
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)local_150,local_a8,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(local_150,0));
  QPDFWriter::setStaticID(SUB81(local_150,0));
  QPDFWriter::write();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

static void
test_51(QPDF& pdf, char const* arg2)
{
    // Test radio button and checkbox field setting. The input
    // files must have radios button called r1 and r2 and
    // checkboxes called checkbox1 and checkbox2. The files
    // button-set*.pdf are designed for this test case.
    QPDFObjectHandle acroform = pdf.getRoot().getKey("/AcroForm");
    QPDFObjectHandle fields = acroform.getKey("/Fields");
    int nitems = fields.getArrayNItems();
    for (int i = 0; i < nitems; ++i) {
        QPDFObjectHandle field = fields.getArrayItem(i);
        QPDFObjectHandle T = field.getKey("/T");
        if (!T.isString()) {
            continue;
        }
        std::string Tval = T.getUTF8Value();
        if (Tval == "r1") {
            std::cout << "setting r1 via parent\n";
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/2"));
        } else if (Tval == "r2") {
            std::cout << "setting r2 via child\n";
            field = field.getKey("/Kids").getArrayItem(1);
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/3"));
        } else if (Tval == "checkbox1") {
            std::cout << "turning checkbox1 on\n";
            QPDFFormFieldObjectHelper foh(field);
            // The value that eventually gets set is based on what's allowed in /N and may not match
            // this value.
            foh.setV(QPDFObjectHandle::newName("/Sure"));
        } else if (Tval == "checkbox2") {
            std::cout << "turning checkbox2 off\n";
            QPDFFormFieldObjectHelper foh(field);
            foh.setV(QPDFObjectHandle::newName("/Off"));
        }
    }
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}